

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_rule.hpp
# Opt level: O1

error_code __thiscall
pstore::exchange::import_ns::rule::
push<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::compilations_index,pstore::transaction<pstore::lock_guard<pstore::transaction_mutex>>*,pstore::exchange::import_ns::string_mapping*>,pstore::transaction<pstore::lock_guard<pstore::transaction_mutex>>*,pstore::exchange::import_ns::string_mapping*>
          (rule *this,transaction<pstore::lock_guard<pstore::transaction_mutex>_> *args,
          string_mapping *args_1)

{
  iterator *piVar1;
  context *pcVar2;
  _Elt_pointer puVar3;
  undefined1 auVar4 [16];
  pointer __p;
  ulong uVar5;
  _Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false> local_30;
  _Head_base<0UL,_pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::compilations_index,_pstore::transaction<pstore::lock_guard<pstore::transaction_mutex>_>_*,_pstore::exchange::import_ns::string_mapping_*>_*,_false>
  local_28;
  
  pcVar2 = (this->context_).ptr_;
  local_30._M_head_impl = (rule *)operator_new(0x20);
  ((local_30._M_head_impl)->context_).ptr_ = pcVar2;
  (local_30._M_head_impl)->_vptr_rule = (_func_int **)&PTR__rule_00244660;
  local_30._M_head_impl[1]._vptr_rule = (_func_int **)args_1;
  local_30._M_head_impl[1].context_.ptr_ = (context *)args;
  local_28._M_head_impl =
       (object_rule<pstore::exchange::import_ns::compilations_index,_pstore::transaction<pstore::lock_guard<pstore::transaction_mutex>_>_*,_pstore::exchange::import_ns::string_mapping_*>
        *)0x0;
  puVar3 = (pcVar2->stack).c.
           super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (puVar3 == (pcVar2->stack).c.
                super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>,std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>>
    ::
    _M_push_back_aux<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>
              ((deque<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>,std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>>
                *)&pcVar2->stack,
               (unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
                *)&local_30);
  }
  else {
    (puVar3->_M_t).
    super___uniq_ptr_impl<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
    .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>._M_head_impl =
         local_30._M_head_impl;
    local_30._M_head_impl = (rule *)0x0;
    piVar1 = &(pcVar2->stack).c.
              super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  if (local_30._M_head_impl != (rule *)0x0) {
    (*(local_30._M_head_impl)->_vptr_rule[1])();
  }
  local_30._M_head_impl = (rule *)0x0;
  std::
  unique_ptr<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::compilations_index,_pstore::transaction<pstore::lock_guard<pstore::transaction_mutex>_>_*,_pstore::exchange::import_ns::string_mapping_*>,_std::default_delete<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::compilations_index,_pstore::transaction<pstore::lock_guard<pstore::transaction_mutex>_>_*,_pstore::exchange::import_ns::string_mapping_*>_>_>
  ::~unique_ptr((unique_ptr<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::compilations_index,_pstore::transaction<pstore::lock_guard<pstore::transaction_mutex>_>_*,_pstore::exchange::import_ns::string_mapping_*>,_std::default_delete<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::compilations_index,_pstore::transaction<pstore::lock_guard<pstore::transaction_mutex>_>_*,_pstore::exchange::import_ns::string_mapping_*>_>_>
                 *)&local_28);
  log_top(this,true);
  uVar5 = std::_V2::system_category();
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar5;
  return (error_code)(auVar4 << 0x40);
}

Assistant:

std::error_code push (Args... args) {
                    context_->stack.push (std::make_unique<T> (context_, args...));
                    this->log_top (true);
                    return {};
                }